

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintDsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint *puVar1;
  uint nVars;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar8;
  Vec_Int_t *vTruth;
  word *pInit;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  uint local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar5 = false;
  Extra_UtilGetoptReset();
  local_40 = 1;
  bVar3 = false;
  bVar4 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar6 = Extra_UtilGetopt(argc,argv,"Npcdh"), iVar14 = globalUtilOptind, iVar6 == 99)
        {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        if (iVar6 == -1) {
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar13 = "Empty network.\n";
          }
          else if (pNtk->ntkType == ABC_NTK_LOGIC) {
            Abc_NtkToAig(pNtk);
            pAVar8 = Abc_NtkPo(pNtk,0);
            pvVar2 = pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
            if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7) {
              if (*(int *)((long)pvVar2 + 0x1c) < 0x11) {
                vTruth = Vec_IntAlloc(0);
                pInit = (word *)Hop_ManConvertAigToTruth
                                          ((Hop_Man_t *)pNtk->pManFunc,
                                           (Hop_Obj_t *)
                                           (*(ulong *)((long)pvVar2 + 0x38) & 0xfffffffffffffffe),
                                           *(int *)((long)pvVar2 + 0x1c),vTruth,0);
                if ((*(byte *)((long)pvVar2 + 0x38) & 1) != 0) {
                  uVar9 = (ulong)(uint)(1 << ((char)*(int *)((long)pvVar2 + 0x1c) - 5U & 0x1f));
                  if (*(int *)((long)pvVar2 + 0x1c) < 6) {
                    uVar9 = 1;
                  }
                  for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
                    puVar1 = (uint *)((long)pInit + uVar9 * 4 + -4);
                    *puVar1 = ~*puVar1;
                  }
                }
                if (bVar5) {
                  nVars = *(uint *)((long)pvVar2 + 0x1c);
                  if ((int)nVars < 6) {
                    if ((int)nVars < 0) {
                      __assert_fail("nVars >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                    ,0x30d,"word Abc_Tt6Stretch(word, int)");
                    }
                    uVar7 = 2;
                    if (2 < nVars) {
                      uVar7 = nVars;
                    }
                    uVar10 = 3;
                    if (2 < nVars) {
                      uVar10 = uVar7;
                    }
                    uVar7 = 4;
                    if (uVar10 != 3) {
                      uVar7 = uVar10;
                    }
                    if (2 < uVar7 - 4) {
                      __assert_fail("nVars == 6",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                    ,0x31a,"word Abc_Tt6Stretch(word, int)");
                    }
                    uVar11 = (uint)*pInit;
                    uVar15 = -(uVar11 & 1);
                    if (nVars != 0) {
                      uVar15 = uVar11;
                    }
                    uVar15 = (uVar15 & 3) * 5;
                    if (1 < nVars) {
                      uVar15 = uVar11;
                    }
                    uVar9 = (ulong)(uVar15 & 0xf) * 0x11;
                    if (2 < nVars) {
                      uVar9 = *pInit;
                    }
                    uVar12 = (uVar9 & 0xff) * 0x101;
                    if (uVar10 != 3) {
                      uVar12 = uVar9;
                    }
                    uVar9 = (ulong)(((uint)uVar12 & 0xffff) * 0x10001);
                    if (uVar7 != 4) {
                      uVar9 = uVar12;
                    }
                    *pInit = (uVar9 & 0xffffffff) * 0x100000001;
                  }
                  Dau_DecTrySets(pInit,nVars,1);
                }
                if (bVar3) {
                  Kit_TruthPrintProfile((uint *)pInit,*(int *)((long)pvVar2 + 0x1c));
                }
                else if (bVar4) {
                  Kit_DsdPrintCofactors((uint *)pInit,*(int *)((long)pvVar2 + 0x1c),local_40,1);
                }
                else {
                  Kit_DsdTest((uint *)pInit,*(int *)((long)pvVar2 + 0x1c));
                }
                Vec_IntFree(vTruth);
                return 0;
              }
              pcVar13 = "Currently works only for up to 16 inputs.\n";
            }
            else {
              pcVar13 = "The fanin of the first PO node does not have a logic function.\n";
            }
          }
          else {
            pcVar13 = "Currently works only for logic networks.\n";
          }
          iVar14 = -1;
          goto LAB_001e8ad2;
        }
        if (iVar6 != 0x70) break;
        bVar3 = (bool)(bVar3 ^ 1);
      }
      if (iVar6 != 100) break;
      bVar5 = (bool)(bVar5 ^ 1);
    }
    if (iVar6 != 0x4e) goto LAB_001e8a37;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar14 + 1;
    if ((int)local_40 < 0) {
LAB_001e8a37:
      iVar14 = -2;
      Abc_Print(-2,"usage: print_dsd [-pcdh] [-N <num>]\n");
      Abc_Print(-2,
                "\t           print DSD formula for a single-output function with less than 16 variables\n"
               );
      pcVar16 = "yes";
      pcVar13 = "yes";
      if (!bVar3) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-p       : toggle printing profile [default = %s]\n",pcVar13);
      pcVar13 = "yes";
      if (!bVar4) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-c       : toggle recursive cofactoring [default = %s]\n",pcVar13);
      if (!bVar5) {
        pcVar16 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle printing decompositions [default = %s]\n",pcVar16);
      Abc_Print(-2,"\t-N <num> : the number of levels to cofactor [default = %d]\n",(ulong)local_40)
      ;
      pcVar13 = "\t-h       : print the command usage\n";
LAB_001e8ad2:
      Abc_Print(iVar14,pcVar13);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_001e8a37;
}

Assistant:

int Abc_CommandPrintDsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fCofactor;
    int nCofLevel;
    int fProfile;
    int fPrintDec;

    extern void Kit_DsdTest( unsigned * pTruth, int nVars );
    extern void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose );
    extern void Dau_DecTrySets( word * p, int nVars, int fVerbose );

    // set defaults
    nCofLevel = 1;
    fCofactor = 0;
    fProfile  = 0;
    fPrintDec = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Npcdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofLevel < 0 )
                goto usage;
            break;
        case 'p':
            fProfile ^= 1;
            break;
        case 'c':
            fCofactor ^= 1;
            break;
        case 'd':
            fPrintDec ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // get the truth table of the first output
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Currently works only for logic networks.\n" );
        return 1;
    }
    Abc_NtkToAig( pNtk );
    // convert it to truth table
    {
        Abc_Obj_t * pObj = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        Vec_Int_t * vMemory;
        unsigned * pTruth;
        if ( !Abc_ObjIsNode(pObj) )
        {
            Abc_Print( -1, "The fanin of the first PO node does not have a logic function.\n" );
            return 1;
        }
        if ( Abc_ObjFaninNum(pObj) > 16 )
        {
            Abc_Print( -1, "Currently works only for up to 16 inputs.\n" );
            return 1;
        }
        vMemory = Vec_IntAlloc(0);
        pTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, Hop_Regular((Hop_Obj_t *)pObj->pData), Abc_ObjFaninNum(pObj), vMemory, 0 );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            Extra_TruthNot( pTruth, pTruth, Abc_ObjFaninNum(pObj) );
//        Extra_PrintBinary( stdout, pTruth, 1 << Abc_ObjFaninNum(pObj) );
//        Abc_Print( -1, "\n" );
        if ( fPrintDec )//&&Abc_ObjFaninNum(pObj) <= 6 )
        {
            word * pTruthW = (word *)pTruth;
            if ( Abc_ObjFaninNum(pObj) < 6 )
                pTruthW[0] = Abc_Tt6Stretch( pTruthW[0], Abc_ObjFaninNum(pObj) );
            Dau_DecTrySets( (word *)pTruth, Abc_ObjFaninNum(pObj), 1 );
        }
        if ( fProfile )
            Kit_TruthPrintProfile( pTruth, Abc_ObjFaninNum(pObj) );
        else if ( fCofactor )
            Kit_DsdPrintCofactors( pTruth, Abc_ObjFaninNum(pObj), nCofLevel, 1 );
        else
            Kit_DsdTest( pTruth, Abc_ObjFaninNum(pObj) );
        Vec_IntFree( vMemory );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_dsd [-pcdh] [-N <num>]\n" );
    Abc_Print( -2, "\t           print DSD formula for a single-output function with less than 16 variables\n" );
    Abc_Print( -2, "\t-p       : toggle printing profile [default = %s]\n", fProfile? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle recursive cofactoring [default = %s]\n", fCofactor? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggle printing decompositions [default = %s]\n", fPrintDec? "yes": "no" );
    Abc_Print( -2, "\t-N <num> : the number of levels to cofactor [default = %d]\n", nCofLevel );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}